

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgap_dictionary.h
# Opt level: O3

void __thiscall
bwtil::cgap_dictionary::cgap_dictionary
          (cgap_dictionary *this,
          vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          *gaps)

{
  _Rb_tree_header *p_Var1;
  long lVar2;
  double dVar3;
  uint uVar4;
  void *pvVar5;
  pointer puVar6;
  size_t sVar7;
  ulong *puVar8;
  pointer ptVar9;
  pointer ptVar10;
  bool bVar11;
  undefined1 auVar12 [16];
  ulong uVar13;
  pointer pvVar14;
  ulint uVar15;
  undefined1 (*pauVar16) [64];
  double *pdVar17;
  mapped_type *this_00;
  ulong *puVar18;
  ulint i;
  ulong uVar19;
  long lVar20;
  uint *puVar21;
  size_t sVar22;
  pointer ppVar23;
  ulint p;
  pair<unsigned_long,_unsigned_long> *ppVar24;
  ulong uVar25;
  iterator __end2;
  iterator __position;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  *pvVar26;
  uint8_t uVar27;
  unsigned_long *puVar28;
  size_t begin;
  long lVar29;
  ulong uVar30;
  int iVar31;
  char cVar32;
  char cVar33;
  pointer pvVar34;
  iterator __begin2;
  pair<unsigned_long,_unsigned_long> *ppVar35;
  size_t sVar36;
  byte bVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [32];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar40 [32];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [16];
  undefined1 auVar50 [64];
  undefined1 in_ZMM3 [64];
  undefined1 auVar51 [16];
  undefined1 in_ZMM4 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [16];
  undefined1 in_ZMM8 [64];
  HuffmanTree<unsigned_long> ht;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  *__range2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> freqs;
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  local_128;
  HuffmanTree<unsigned_long> local_108;
  double local_d0;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  *local_c8;
  packed_view<std::vector> *local_c0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_b8;
  vector<std::tuple<unsigned_long,unsigned_long,unsigned_char>,std::allocator<std::tuple<unsigned_long,unsigned_long,unsigned_char>>>
  *local_a0;
  map<unsigned_long,_std::vector<bool,_std::allocator<bool>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<bool,_std::allocator<bool>_>_>_>_>
  *local_98;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_90;
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  local_78;
  undefined1 local_58 [16];
  pointer local_48;
  undefined1 auVar52 [64];
  
  auVar51 = in_ZMM4._0_16_;
  auVar49 = in_ZMM3._0_16_;
  auVar54 = in_ZMM8._0_16_;
  local_a0 = (vector<std::tuple<unsigned_long,unsigned_long,unsigned_char>,std::allocator<std::tuple<unsigned_long,unsigned_long,unsigned_char>>>
              *)&this->H_long;
  (this->encoding)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->encoding)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_c0 = &this->H_len;
  local_98 = &this->encoding;
  p_Var1 = &(this->encoding)._M_t._M_impl.super__Rb_tree_header;
  (this->H_val)._bits._container.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->H_val)._bits._container.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->H_val)._bits._container.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->H_val)._size = 0;
  (this->H_val)._width = 0;
  (this->H_val)._field_mask = 0;
  (this->H_len)._bits._container.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->H_len)._bits._container.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->H_len)._bits._container.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->H_len)._bits._container.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->H_len)._size = 0;
  (this->H_len)._width = 0;
  (this->H_len)._field_mask = 0;
  (this->H_long).
  super__Vector_base<std::tuple<unsigned_long,_unsigned_long,_unsigned_char>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->H_long).
  super__Vector_base<std::tuple<unsigned_long,_unsigned_long,_unsigned_char>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->H_long).
  super__Vector_base<std::tuple<unsigned_long,_unsigned_long,_unsigned_char>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->encoding)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->encoding)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->encoding)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->prefix_length = '\0';
  this->log2_max_gap = 0;
  __position._M_current =
       (gaps->
       super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  ppVar35 = (gaps->
            super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_c8 = gaps;
  if ((long)__position._M_current - (long)ppVar35 == 0x10) {
    local_108.sigma_0 = ppVar35->first + 1;
    local_108.frequencies.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x1;
    if (__position._M_current ==
        (gaps->
        super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
      ::std::
      vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
      ::_M_realloc_insert<std::pair<unsigned_long,unsigned_long>>
                ((vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                  *)gaps,__position,(pair<unsigned_long,_unsigned_long> *)&local_108);
      __position._M_current =
           (gaps->
           super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      (__position._M_current)->first = local_108.sigma_0;
      (__position._M_current)->second = 1;
      __position._M_current =
           (gaps->
           super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
           )._M_impl.super__Vector_impl_data._M_finish + 1;
      (gaps->
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      )._M_impl.super__Vector_impl_data._M_finish = __position._M_current;
    }
    ppVar35 = (gaps->
              super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
  }
  if (ppVar35 == __position._M_current) {
    this->log2_max_gap = 1;
    local_128.
    super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
    local_128.
    super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_128.
    super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
    local_d0 = 0.0;
  }
  else {
    auVar41 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar39 = vpmovsxbd_avx2(ZEXT816(0x7060504030201000));
    auVar52 = ZEXT3264(auVar39);
    auVar51 = auVar39._0_16_;
    auVar50 = ZEXT1664((undefined1  [16])0x0);
    auVar53 = ZEXT1664((undefined1  [16])0x0);
    uVar19 = 0;
    auVar42 = vpbroadcastq_avx512f();
    auVar42 = vpsrlq_avx512f(auVar42,4);
    ppVar24 = ppVar35;
    do {
      auVar43 = vpbroadcastq_avx512f();
      auVar44 = vmovdqa64_avx512f(auVar50);
      auVar45 = vmovdqa64_avx512f(auVar53);
      uVar19 = uVar19 + 8;
      auVar53 = vporq_avx512f(auVar43,auVar41);
      uVar25 = vpcmpuq_avx512f(auVar53,auVar42,2);
      auVar53 = vpgatherdq_avx512f((int)ppVar24->first);
      bVar37 = (byte)uVar25;
      auVar50._8_8_ = (ulong)((byte)(uVar25 >> 1) & 1) * auVar53._8_8_;
      auVar50._0_8_ = (ulong)(bVar37 & 1) * auVar53._0_8_;
      auVar50._16_8_ = (ulong)((byte)(uVar25 >> 2) & 1) * auVar53._16_8_;
      auVar50._24_8_ = (ulong)((byte)(uVar25 >> 3) & 1) * auVar53._24_8_;
      auVar50._32_8_ = (ulong)((byte)(uVar25 >> 4) & 1) * auVar53._32_8_;
      auVar50._40_8_ = (ulong)((byte)(uVar25 >> 5) & 1) * auVar53._40_8_;
      auVar50._48_8_ = (ulong)((byte)(uVar25 >> 6) & 1) * auVar53._48_8_;
      auVar50._56_8_ = (uVar25 >> 7) * auVar53._56_8_;
      auVar53 = vpgatherdq_avx512f((int)ppVar24->second);
      auVar43._8_8_ = (ulong)((byte)(uVar25 >> 1) & 1) * auVar53._8_8_;
      auVar43._0_8_ = (ulong)(bVar37 & 1) * auVar53._0_8_;
      auVar43._16_8_ = (ulong)((byte)(uVar25 >> 2) & 1) * auVar53._16_8_;
      auVar43._24_8_ = (ulong)((byte)(uVar25 >> 3) & 1) * auVar53._24_8_;
      auVar43._32_8_ = (ulong)((byte)(uVar25 >> 4) & 1) * auVar53._32_8_;
      auVar43._40_8_ = (ulong)((byte)(uVar25 >> 5) & 1) * auVar53._40_8_;
      auVar43._48_8_ = (ulong)((byte)(uVar25 >> 6) & 1) * auVar53._48_8_;
      auVar43._56_8_ = (uVar25 >> 7) * auVar53._56_8_;
      ppVar24 = ppVar24 + 8;
      auVar53 = vpmaxuq_avx512f(auVar50,auVar45);
      auVar50 = vpaddq_avx512f(auVar43,auVar44);
    } while ((((ulong)((long)__position._M_current + (-0x10 - (long)ppVar35)) >> 4) + 8 &
             0xfffffffffffffff8) != uVar19);
    auVar41 = vmovdqa64_avx512f(auVar53);
    auVar42._0_8_ = (ulong)(bVar37 & 1) * auVar41._0_8_ | (ulong)!(bool)(bVar37 & 1) * auVar45._0_8_
    ;
    bVar11 = (bool)((byte)(uVar25 >> 1) & 1);
    auVar42._8_8_ = (ulong)bVar11 * auVar41._8_8_ | (ulong)!bVar11 * auVar45._8_8_;
    bVar11 = (bool)((byte)(uVar25 >> 2) & 1);
    auVar42._16_8_ = (ulong)bVar11 * auVar41._16_8_ | (ulong)!bVar11 * auVar45._16_8_;
    bVar11 = (bool)((byte)(uVar25 >> 3) & 1);
    auVar42._24_8_ = (ulong)bVar11 * auVar41._24_8_ | (ulong)!bVar11 * auVar45._24_8_;
    bVar11 = (bool)((byte)(uVar25 >> 4) & 1);
    auVar42._32_8_ = (ulong)bVar11 * auVar41._32_8_ | (ulong)!bVar11 * auVar45._32_8_;
    bVar11 = (bool)((byte)(uVar25 >> 5) & 1);
    auVar42._40_8_ = (ulong)bVar11 * auVar41._40_8_ | (ulong)!bVar11 * auVar45._40_8_;
    bVar11 = (bool)((byte)(uVar25 >> 6) & 1);
    auVar42._48_8_ = (ulong)bVar11 * auVar41._48_8_ | (ulong)!bVar11 * auVar45._48_8_;
    auVar42._56_8_ = (uVar25 >> 7) * auVar41._56_8_ | (ulong)!SUB81(uVar25 >> 7,0) * auVar45._56_8_;
    auVar39 = vextracti64x4_avx512f(auVar42,1);
    auVar53 = vmovdqa64_avx512f(auVar50);
    auVar41._0_8_ = (ulong)(bVar37 & 1) * auVar53._0_8_ | (ulong)!(bool)(bVar37 & 1) * auVar44._0_8_
    ;
    bVar11 = (bool)((byte)(uVar25 >> 1) & 1);
    auVar41._8_8_ = (ulong)bVar11 * auVar53._8_8_ | (ulong)!bVar11 * auVar44._8_8_;
    bVar11 = (bool)((byte)(uVar25 >> 2) & 1);
    auVar41._16_8_ = (ulong)bVar11 * auVar53._16_8_ | (ulong)!bVar11 * auVar44._16_8_;
    bVar11 = (bool)((byte)(uVar25 >> 3) & 1);
    auVar41._24_8_ = (ulong)bVar11 * auVar53._24_8_ | (ulong)!bVar11 * auVar44._24_8_;
    bVar11 = (bool)((byte)(uVar25 >> 4) & 1);
    auVar41._32_8_ = (ulong)bVar11 * auVar53._32_8_ | (ulong)!bVar11 * auVar44._32_8_;
    bVar11 = (bool)((byte)(uVar25 >> 5) & 1);
    auVar41._40_8_ = (ulong)bVar11 * auVar53._40_8_ | (ulong)!bVar11 * auVar44._40_8_;
    bVar11 = (bool)((byte)(uVar25 >> 6) & 1);
    auVar41._48_8_ = (ulong)bVar11 * auVar53._48_8_ | (ulong)!bVar11 * auVar44._48_8_;
    auVar41._56_8_ = (uVar25 >> 7) * auVar53._56_8_ | (ulong)!SUB81(uVar25 >> 7,0) * auVar44._56_8_;
    auVar40 = vextracti64x4_avx512f(auVar41,1);
    auVar42 = vpmaxuq_avx512f(auVar42,ZEXT3264(auVar39));
    auVar41 = vpaddq_avx512f(auVar41,ZEXT3264(auVar40));
    auVar49 = vpaddq_avx(auVar41._0_16_,auVar41._16_16_);
    auVar38 = vpmaxuq_avx512vl(auVar42._0_16_,auVar42._16_16_);
    auVar12 = vpshufd_avx(auVar49,0xee);
    auVar12 = vpaddq_avx(auVar49,auVar12);
    auVar49 = vpshufd_avx(auVar38,0xee);
    auVar41 = ZEXT1664(auVar49);
    auVar38 = vpmaxuq_avx512vl(auVar38,auVar49);
    auVar54 = vcvtusi2sd_avx512f(auVar54,auVar12._0_8_);
    local_d0 = auVar54._0_8_;
    uVar15 = 1;
    if (auVar38._0_8_ != 0) {
      uVar15 = 0x40 - LZCOUNT(auVar38._0_8_);
    }
    this->log2_max_gap = uVar15;
    local_128.
    super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_128.
    super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_128.
    super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
    local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
    if (ppVar35 != __position._M_current) {
      do {
        local_108._0_16_ = *ppVar35;
        if (local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          auVar41 = ZEXT1664(auVar41._0_16_);
          auVar52 = ZEXT1664(auVar52._0_16_);
          ::std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long_const&>
                    ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_b8,
                     (iterator)
                     local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish,
                     (unsigned_long *)((long)&local_108 + 8));
        }
        else {
          *local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish = ppVar35->second;
          local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        auVar51 = auVar52._0_16_;
        auVar49 = auVar41._0_16_;
        ppVar35 = ppVar35 + 1;
      } while (ppVar35 != __position._M_current);
    }
  }
  auVar41 = ZEXT1664(auVar49);
  auVar42 = ZEXT1664(auVar51);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_90,&local_b8);
  HuffmanTree<unsigned_long>::HuffmanTree(&local_108,&local_90);
  if (local_90.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ::vector(&local_78,
           (vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
            *)((long)&local_108 + 0x20));
  pvVar14 = local_78.
            super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_48 = local_128.
             super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_58._8_8_ =
       local_128.
       super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_58._0_8_ =
       local_128.
       super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_78.
  super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_128.
  super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = pvVar14;
  local_128.
  super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_78.
       super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_128.
  super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_78.
       super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_78.
  super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ::~vector((vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
             *)local_58);
  std::
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ::~vector(&local_78);
  pvVar14 = local_128.
            super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (local_128.
      super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_128.
      super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pvVar34 = local_128.
              super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      std::vector<bool,_std::allocator<bool>_>::vector
                ((vector<bool,_std::allocator<bool>_> *)local_58,pvVar34);
      if ((pointer)local_58._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_58._0_8_);
      }
      pvVar34 = pvVar34 + 1;
    } while (pvVar34 != pvVar14);
  }
  std::
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ::~vector((vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
             *)((long)&local_108 + 0x20));
  if (local_108.frequencies.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_108.frequencies.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  pauVar16 = (undefined1 (*) [64])operator_new(0x200);
  pvVar14 = local_128.
            super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  auVar49 = auVar42._0_16_;
  auVar53 = ZEXT864(0) << 0x40;
  pauVar16[7] = auVar53;
  pauVar16[6] = auVar53;
  pauVar16[5] = auVar53;
  pauVar16[4] = auVar53;
  pauVar16[3] = auVar53;
  pauVar16[2] = auVar53;
  pauVar16[1] = auVar53;
  *pauVar16 = auVar53;
  if (local_128.
      super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_128.
      super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pvVar34 = local_128.
              super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      auVar41 = ZEXT1664(auVar41._0_16_);
      auVar42 = ZEXT1664(auVar42._0_16_);
      std::vector<bool,_std::allocator<bool>_>::vector
                ((vector<bool,_std::allocator<bool>_> *)&local_108,pvVar34);
      auVar53 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      auVar41 = vpternlogd_avx512f(auVar41,auVar41,auVar41,0xff);
      lVar20 = ((long)local_108.frequencies.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_finish - local_108.sigma_0) * 8 +
               (ulong)(uint)local_108.frequencies.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage;
      if (lVar20 != 0) {
        auVar50 = vpbroadcastq_avx512f();
        uVar19 = 0;
        do {
          auVar52 = vpbroadcastq_avx512f();
          auVar52 = vporq_avx512f(auVar52,auVar53);
          uVar25 = vpcmpuq_avx512f(auVar52,auVar50,2);
          auVar52 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)*pauVar16 + uVar19 * 8));
          auVar44._8_8_ = (ulong)((byte)(uVar25 >> 1) & 1) * auVar52._8_8_;
          auVar44._0_8_ = (ulong)((byte)uVar25 & 1) * auVar52._0_8_;
          auVar44._16_8_ = (ulong)((byte)(uVar25 >> 2) & 1) * auVar52._16_8_;
          auVar44._24_8_ = (ulong)((byte)(uVar25 >> 3) & 1) * auVar52._24_8_;
          auVar44._32_8_ = (ulong)((byte)(uVar25 >> 4) & 1) * auVar52._32_8_;
          auVar44._40_8_ = (ulong)((byte)(uVar25 >> 5) & 1) * auVar52._40_8_;
          auVar44._48_8_ = (ulong)((byte)(uVar25 >> 6) & 1) * auVar52._48_8_;
          auVar44._56_8_ = (uVar25 >> 7) * auVar52._56_8_;
          auVar52 = vpsubq_avx512f(auVar44,auVar41);
          auVar52 = vmovdqu64_avx512f(auVar52);
          *(undefined1 (*) [64])((long)*pauVar16 + uVar19 * 8) = auVar52;
          uVar19 = uVar19 + 8;
        } while ((lVar20 + 7U & 0xfffffffffffffff8) != uVar19);
      }
      if ((_Bit_type *)local_108.sigma_0 != (_Bit_type *)0x0) {
        auVar41 = ZEXT1664(auVar41._0_16_);
        auVar42 = ZEXT1664(auVar42._0_16_);
        operator_delete((void *)local_108.sigma_0);
      }
      auVar49 = auVar42._0_16_;
      pvVar34 = pvVar34 + 1;
    } while (pvVar34 != pvVar14);
  }
  pdVar17 = (double *)operator_new(0x200);
  pdVar17[0x38] = 0.0;
  pdVar17[0x39] = 0.0;
  pdVar17[0x3a] = 0.0;
  pdVar17[0x3b] = 0.0;
  pdVar17[0x3c] = 0.0;
  pdVar17[0x3d] = 0.0;
  pdVar17[0x3e] = 0.0;
  pdVar17[0x3f] = 0.0;
  pdVar17[0x30] = 0.0;
  pdVar17[0x31] = 0.0;
  pdVar17[0x32] = 0.0;
  pdVar17[0x33] = 0.0;
  pdVar17[0x34] = 0.0;
  pdVar17[0x35] = 0.0;
  pdVar17[0x36] = 0.0;
  pdVar17[0x37] = 0.0;
  pdVar17[0x28] = 0.0;
  pdVar17[0x29] = 0.0;
  pdVar17[0x2a] = 0.0;
  pdVar17[0x2b] = 0.0;
  pdVar17[0x2c] = 0.0;
  pdVar17[0x2d] = 0.0;
  pdVar17[0x2e] = 0.0;
  pdVar17[0x2f] = 0.0;
  pdVar17[0x20] = 0.0;
  pdVar17[0x21] = 0.0;
  pdVar17[0x22] = 0.0;
  pdVar17[0x23] = 0.0;
  pdVar17[0x24] = 0.0;
  pdVar17[0x25] = 0.0;
  pdVar17[0x26] = 0.0;
  pdVar17[0x27] = 0.0;
  pdVar17[0x18] = 0.0;
  pdVar17[0x19] = 0.0;
  pdVar17[0x1a] = 0.0;
  pdVar17[0x1b] = 0.0;
  pdVar17[0x1c] = 0.0;
  pdVar17[0x1d] = 0.0;
  pdVar17[0x1e] = 0.0;
  pdVar17[0x1f] = 0.0;
  pdVar17[0x10] = 0.0;
  pdVar17[0x11] = 0.0;
  pdVar17[0x12] = 0.0;
  pdVar17[0x13] = 0.0;
  pdVar17[0x14] = 0.0;
  pdVar17[0x15] = 0.0;
  pdVar17[0x16] = 0.0;
  pdVar17[0x17] = 0.0;
  pdVar17[8] = 0.0;
  pdVar17[9] = 0.0;
  pdVar17[10] = 0.0;
  pdVar17[0xb] = 0.0;
  pdVar17[0xc] = 0.0;
  pdVar17[0xd] = 0.0;
  pdVar17[0xe] = 0.0;
  pdVar17[0xf] = 0.0;
  *pdVar17 = 0.0;
  pdVar17[1] = 0.0;
  pdVar17[2] = 0.0;
  pdVar17[3] = 0.0;
  pdVar17[4] = 0.0;
  pdVar17[5] = 0.0;
  pdVar17[6] = 0.0;
  pdVar17[7] = 0.0;
  if ((long)local_128.
            super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_128.
            super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != 0) {
    lVar20 = ((long)local_128.
                    super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_128.
                    super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
    lVar20 = lVar20 + (ulong)(lVar20 == 0);
    puVar21 = &((local_128.
                 super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
               super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
               _M_finish.super__Bit_iterator_base._M_offset;
    puVar28 = &((local_c8->
                super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                )._M_impl.super__Vector_impl_data._M_start)->second;
    do {
      uVar4 = *puVar21;
      auVar51 = vcvtusi2sd_avx512f(auVar49,*puVar28);
      puVar28 = puVar28 + 2;
      lVar29 = (long)((_Bit_iterator_base *)(puVar21 + -2))->_M_p - *(long *)(puVar21 + -6);
      puVar21 = puVar21 + 10;
      lVar20 = lVar20 + -1;
      pdVar17[lVar29 * 8 + (ulong)uVar4] = auVar51._0_8_ + pdVar17[lVar29 * 8 + (ulong)uVar4];
    } while (lVar20 != 0);
  }
  dVar3 = *pdVar17;
  lVar20 = 1;
  do {
    dVar3 = dVar3 + pdVar17[lVar20];
    pdVar17[lVar20] = dVar3;
    lVar20 = lVar20 + 1;
  } while (lVar20 != 0x40);
  auVar41 = vbroadcastsd_avx512f(ZEXT816(0x4059000000000000));
  lVar20 = 0;
  auVar49._0_8_ = 1.0 / local_d0;
  auVar49._8_8_ = 0;
  auVar42 = vbroadcastsd_avx512f(auVar49);
  do {
    auVar53 = vmulpd_avx512f(auVar41,*(undefined1 (*) [64])(pdVar17 + lVar20));
    auVar53 = vmulpd_avx512f(auVar53,auVar42);
    *(undefined1 (*) [64])(pdVar17 + lVar20) = auVar53;
    lVar20 = lVar20 + 8;
  } while (lVar20 != 0x40);
  this->prefix_length = '\x01';
  uVar25 = 1;
  uVar19 = 0x8000000000000000;
  do {
    uVar30 = *(long *)((long)*pauVar16 + uVar25 * 8) * 0xc0 +
             ((this->log2_max_gap - LZCOUNT(uVar25)) + 0x40 << (uVar25 & 0x3f));
    if (uVar30 < uVar19) {
      this->prefix_length = (uint8_t)uVar25;
      uVar19 = uVar30;
    }
    uVar25 = uVar25 + 1;
  } while (uVar25 != 0x1e);
  auVar41 = vpmovsxbq_avx512f(ZEXT816(0x807060504030201));
  auVar42 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
  auVar53 = vpbroadcastq_avx512f(ZEXT816(0x1d));
  auVar50 = vpbroadcastq_avx512f(ZEXT816(0x40));
  auVar52 = vpbroadcastq_avx512f(ZEXT816(0xc0));
  auVar43 = vpbroadcastq_avx512f(ZEXT816(8));
  auVar44 = vpbroadcastq_avx512f();
  lVar20 = 0;
  auVar45 = vpbroadcastq_avx512f();
  do {
    auVar46 = vpbroadcastq_avx512f();
    auVar47 = vplzcntq_avx512cd(auVar41);
    auVar46 = vporq_avx512f(auVar46,auVar42);
    uVar19 = vpcmpuq_avx512f(auVar46,auVar53,1);
    auVar46 = vpsubq_avx512f(auVar44,auVar47);
    auVar48 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)*pauVar16 + lVar20 * 8 + 8));
    auVar47._8_8_ = (ulong)((byte)(uVar19 >> 1) & 1) * auVar48._8_8_;
    auVar47._0_8_ = (ulong)((byte)uVar19 & 1) * auVar48._0_8_;
    auVar47._16_8_ = (ulong)((byte)(uVar19 >> 2) & 1) * auVar48._16_8_;
    auVar47._24_8_ = (ulong)((byte)(uVar19 >> 3) & 1) * auVar48._24_8_;
    auVar47._32_8_ = (ulong)((byte)(uVar19 >> 4) & 1) * auVar48._32_8_;
    auVar47._40_8_ = (ulong)((byte)(uVar19 >> 5) & 1) * auVar48._40_8_;
    auVar47._48_8_ = (ulong)((byte)(uVar19 >> 6) & 1) * auVar48._48_8_;
    auVar47._56_8_ = (uVar19 >> 7) * auVar48._56_8_;
    auVar46 = vpaddq_avx512f(auVar46,auVar50);
    auVar46 = vpsllvq_avx512f(auVar46,auVar41);
    auVar47 = vpmullq_avx512dq(auVar47,auVar52);
    auVar46 = vpaddq_avx512f(auVar46,auVar47);
    uVar25 = vpcmpuq_avx512f(auVar46,auVar45,2);
    uVar19 = uVar19 & uVar25;
    bVar37 = (byte)uVar19;
    if ((((((uVar19 & 1) != 0) || ((uVar19 >> 1 & 1) != 0)) || ((bVar37 >> 2 & 1) != 0)) ||
        (((bVar37 >> 3 & 1) != 0 || ((bVar37 >> 4 & 1) != 0)))) ||
       (((bVar37 >> 5 & 1) != 0 || (((bVar37 >> 6 & 1) != 0 || ((char)bVar37 < '\0')))))) {
      cVar32 = '\x03';
      if ((bVar37 >> 2 & 1) == 0) {
        cVar32 = ((byte)(uVar19 >> 1) & 1) + 1;
      }
      cVar33 = '\x04';
      if ((bVar37 >> 3 & 1) == 0) {
        cVar33 = cVar32;
      }
      cVar32 = '\x05';
      if ((bVar37 >> 4 & 1) == 0) {
        cVar32 = cVar33;
      }
      cVar33 = '\x06';
      if ((bVar37 >> 5 & 1) == 0) {
        cVar33 = cVar32;
      }
      cVar32 = '\a';
      if ((bVar37 >> 6 & 1) == 0) {
        cVar32 = cVar33;
      }
      uVar27 = (char)lVar20 + '\b';
      if (-1 < (char)bVar37) {
        uVar27 = cVar32 + (char)lVar20;
      }
      this->prefix_length = uVar27;
    }
    lVar20 = lVar20 + 8;
    auVar41 = vpaddq_avx512f(auVar41,auVar43);
  } while (lVar20 != 0x20);
  operator_delete(pdVar17);
  operator_delete(pauVar16);
  pvVar26 = local_c8;
  if (local_128.
      super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_128.
      super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar29 = 0;
    lVar20 = 0;
    uVar19 = 0;
    do {
      pvVar14 = local_128.
                super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      this_00 = std::
                map<unsigned_long,_std::vector<bool,_std::allocator<bool>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<bool,_std::allocator<bool>_>_>_>_>
                ::operator[](local_98,(key_type *)
                                      ((long)&((pvVar26->
                                               super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                               )._M_impl.super__Vector_impl_data._M_start)->first +
                                      lVar29));
      std::vector<bool,_std::allocator<bool>_>::operator=
                (this_00,(vector<bool,_std::allocator<bool>_> *)
                         ((long)&(pvVar14->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                         lVar20));
      uVar19 = uVar19 + 1;
      lVar20 = lVar20 + 0x28;
      lVar29 = lVar29 + 0x10;
    } while (uVar19 < (ulong)(((long)local_128.
                                     super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_128.
                                     super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3) *
                             -0x3333333333333333));
  }
  sVar36 = 1L << ((ulong)this->prefix_length & 0x3f);
  bv::internal::packed_view<std::vector>::packed_view
            ((packed_view<std::vector> *)&local_108,this->log2_max_gap,sVar36);
  pvVar5 = (this->H_val)._bits._container.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->H_val)._bits._container.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)local_108.sigma_0;
  (this->H_val)._bits._container.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       local_108.frequencies.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_108._0_16_ = ZEXT816(0) << 0x20;
  (this->H_val)._bits._container.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_108.frequencies.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_108.frequencies.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (pvVar5 == (void *)0x0) {
    (this->H_val)._field_mask =
         (word_type)
         local_108.codes.
         super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (this->H_val)._size =
         CONCAT44(local_108.frequencies.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage._4_4_,
                  (uint)local_108.frequencies.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    (this->H_val)._width =
         (size_t)local_108.codes.
                 super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  }
  else {
    operator_delete(pvVar5);
    (this->H_val)._field_mask =
         (word_type)
         local_108.codes.
         super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (this->H_val)._size =
         CONCAT44(local_108.frequencies.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage._4_4_,
                  (uint)local_108.frequencies.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    (this->H_val)._width =
         (size_t)local_108.codes.
                 super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    if ((_Bit_type *)local_108.sigma_0 != (_Bit_type *)0x0) {
      operator_delete((void *)local_108.sigma_0);
    }
  }
  sVar22 = 1;
  if ((char)*(int *)&this->prefix_length != '\0') {
    sVar22 = (size_t)(byte)(8 - (char)LZCOUNT(*(int *)&this->prefix_length << 0x18));
  }
  bv::internal::packed_view<std::vector>::packed_view
            ((packed_view<std::vector> *)&local_108,sVar22,sVar36);
  puVar6 = (this->H_len)._bits._container.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->H_len)._bits._container.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)local_108.sigma_0;
  (this->H_len)._bits._container.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       local_108.frequencies.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_108._0_16_ = ZEXT816(0) << 0x20;
  (this->H_len)._bits._container.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_108.frequencies.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_108.frequencies.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (puVar6 == (pointer)0x0) {
    (this->H_len)._field_mask =
         (word_type)
         local_108.codes.
         super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (this->H_len)._size =
         CONCAT44(local_108.frequencies.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage._4_4_,
                  (uint)local_108.frequencies.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    (this->H_len)._width =
         (size_t)local_108.codes.
                 super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  }
  else {
    operator_delete(puVar6);
    (this->H_len)._field_mask =
         (word_type)
         local_108.codes.
         super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (this->H_len)._size =
         CONCAT44(local_108.frequencies.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage._4_4_,
                  (uint)local_108.frequencies.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    (this->H_len)._width =
         (size_t)local_108.codes.
                 super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    if ((_Bit_type *)local_108.sigma_0 != (_Bit_type *)0x0) {
      operator_delete((void *)local_108.sigma_0);
    }
  }
  sVar22 = 0;
  while (sVar36 != sVar22) {
    sVar7 = (this->H_len)._width;
    begin = sVar7 * sVar22;
    sVar22 = sVar22 + 1;
    bv::internal::bitview<std::vector>::set(&local_c0->_bits,begin,sVar7 * sVar22,0);
  }
  ppVar23 = (pvVar26->
            super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((pvVar26->
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != ppVar23) {
    uVar19 = 0;
    do {
      puVar18 = local_128.
                super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar19].
                super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
                .super__Bit_iterator_base._M_p;
      puVar8 = local_128.
               super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar19].
               super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
               .super__Bit_iterator_base._M_p;
      uVar4 = local_128.
              super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar19].
              super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
              super__Bit_iterator_base._M_offset;
      dVar3 = (double)((ulong)uVar4 + ((long)puVar8 - (long)puVar18) * 8);
      if ((ulong)this->prefix_length < (ulong)dVar3) {
        uVar25 = 0;
        lVar20 = 0;
        do {
          uVar13 = uVar25 >> 6;
          uVar30 = uVar25 & 0x3f;
          uVar25 = uVar25 + 1;
          lVar20 = (ulong)((uint)(puVar18[uVar13 & 0x3ffffff] >> uVar30) & 1) + lVar20 * 2;
        } while ((uVar25 & 0xffffffff) < (ulong)dVar3);
        local_108.sigma_0._0_1_ = SUB81(dVar3,0);
        local_108.frequencies.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             (pointer)(lVar20 << ((ulong)(byte)-SUB81(dVar3,0) & 0x3f));
        local_108.frequencies.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)ppVar23[uVar19].first;
        ::std::
        vector<std::tuple<unsigned_long,unsigned_long,unsigned_char>,std::allocator<std::tuple<unsigned_long,unsigned_long,unsigned_char>>>
        ::emplace_back<std::tuple<unsigned_long,unsigned_long,unsigned_char>>
                  (local_a0,(tuple<unsigned_long,_unsigned_long,_unsigned_char> *)&local_108);
      }
      else {
        if (puVar18 == puVar8 && uVar4 == 0) {
          lVar20 = 0;
        }
        else {
          lVar20 = 0;
          uVar25 = 0;
          do {
            lVar20 = (ulong)((uint)(*puVar18 >> (uVar25 & 0x3f)) & 1) + lVar20 * 2;
            iVar31 = (int)uVar25;
            uVar25 = (ulong)(iVar31 + 1);
            if (iVar31 == 0x3f) {
              uVar25 = 0;
            }
            puVar18 = puVar18 + (iVar31 == 0x3f);
          } while ((uint)uVar25 != uVar4 || puVar18 != puVar8);
        }
        uVar25 = 1;
        lVar20 = lVar20 << ((ulong)((uint)this->prefix_length - SUB84(dVar3,0)) & 0x3f);
        local_d0 = dVar3;
        do {
          sVar36 = (this->H_val)._width;
          lVar29 = lVar20 + uVar25;
          lVar2 = lVar20 + -1 + uVar25;
          bv::internal::bitview<std::vector>::set
                    ((bitview<std::vector> *)this,sVar36 * lVar2,sVar36 * lVar29,
                     (pvVar26->
                     super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                     )._M_impl.super__Vector_impl_data._M_start[uVar19].first);
          dVar3 = local_d0;
          sVar36 = (this->H_len)._width;
          bv::internal::bitview<std::vector>::set
                    (&local_c0->_bits,lVar2 * sVar36,lVar29 * sVar36,(word_type)local_d0);
          uVar30 = uVar25 >> ((ulong)(uint)(*(int *)&this->prefix_length - SUB84(dVar3,0)) & 0x3f);
          uVar25 = uVar25 + 1;
          pvVar26 = local_c8;
        } while (uVar30 == 0);
      }
      ppVar23 = (pvVar26->
                super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      uVar19 = uVar19 + 1;
    } while (uVar19 < (ulong)((long)(pvVar26->
                                    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar23 >> 4
                             ));
  }
  ptVar9 = (this->H_long).
           super__Vector_base<std::tuple<unsigned_long,_unsigned_long,_unsigned_char>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_char>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ptVar10 = (this->H_long).
            super__Vector_base<std::tuple<unsigned_long,_unsigned_long,_unsigned_char>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_char>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ptVar9 != ptVar10) {
    ::std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::tuple<unsigned_long,unsigned_long,unsigned_char>*,std::vector<std::tuple<unsigned_long,unsigned_long,unsigned_char>,std::allocator<std::tuple<unsigned_long,unsigned_long,unsigned_char>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bwtil::cgap_dictionary::cgap_dictionary(std::vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>)::_lambda(std::tuple<unsigned_long,unsigned_long,unsigned_char>,std::tuple<unsigned_long,unsigned_long,unsigned_char>)_1_>>
              (ptVar9,ptVar10,
               (int)LZCOUNT(((long)ptVar10 - (long)ptVar9 >> 3) * -0x5555555555555555) * 2 ^ 0x7e);
    ::std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<std::tuple<unsigned_long,unsigned_long,unsigned_char>*,std::vector<std::tuple<unsigned_long,unsigned_long,unsigned_char>,std::allocator<std::tuple<unsigned_long,unsigned_long,unsigned_char>>>>,__gnu_cxx::__ops::_Iter_comp_iter<bwtil::cgap_dictionary::cgap_dictionary(std::vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>)::_lambda(std::tuple<unsigned_long,unsigned_long,unsigned_char>,std::tuple<unsigned_long,unsigned_long,unsigned_char>)_1_>>
              (ptVar9,ptVar10);
  }
  std::
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ::~vector(&local_128);
  return;
}

Assistant:

cgap_dictionary(vector<pair<ulint,ulint> > gaps){

		assert(gaps.size()>0);

		//if there is only 1 distinct gap, this creates problems with the huffman codes ...
		//in this case, create one fake gap. There will be 2 codes: 0 and 1
		if(gaps.size()==1)
			gaps.push_back({gaps[0].first+1,1});

		//compute u and n
		ulint u=0;
		ulint n=0;

		ulint max_gap=0;

		for(auto g : gaps){

			assert(g.first>0);
			assert(g.second>0);

			u += (g.first*g.second);
			n += g.second;

			if(g.first>max_gap)
				max_gap=g.first;

		}

		log2_max_gap = intlog2(max_gap);

		//build Huffman tree and retrieve boolean codes
		vector<vector<bool> > codes;

		{
			vector<ulint> freqs;

			for(auto g : gaps)
				freqs.push_back(g.second);

			HuffmanTree<ulint> ht(freqs);

			codes = ht.getCodes();

			for(auto c : codes){

				//make sure that no code is longer than 63 bits
				assert(c.size()<sizeof(ulint)*8);

			}

		}

		assert(codes.size()==gaps.size());

		{
			//count long codes
			vector<ulint> long_codes(64,0);
			for(auto c : codes)
				for(ulint i=0;i<c.size();++i)
					long_codes[i]++;

			//just for testing purposes: code_freq[i] contains the cumulative
			//frequency of codes having length <= i
			vector<double> code_freq(64,0);
			for(ulint i=0;i<codes.size();++i)
				code_freq[codes[i].size()]+=gaps[i].second;
			for(ulint i=1;i<code_freq.size();++i)
				code_freq[i] += code_freq[i-1];
			for(ulint i=0;i<code_freq.size();++i)
				code_freq[i] = 100*code_freq[i]/n;

			//compute optimal prefix length for the hash table,
			//i.e. prefix length that minimizes overall size of the dictionary

			prefix_length=1;
			ulint opt_bitsize = ulint(1)<<63;

			//for efficiency reasons, we limit the maximum prefix length to 30 (in order to avoid
			//huge dictionaries)
			for(ulint p=1;p<30;++p){

				//cout << p << " " << code_freq[p] << " " << long_codes[p] << " " << assess_bitsize(p,long_codes[p]) << endl;

				if(assess_bitsize(p,long_codes[p])<opt_bitsize){

					opt_bitsize = assess_bitsize(p,long_codes[p]);
					prefix_length = p;

				}

			}

			//now choose largest prefix that exceeds at most 20% the optimal bitsize
			ulint max_allowed_bitsize = opt_bitsize + (20*opt_bitsize)/100;

			//cout << "opt p = " << (uint)prefix_length << endl;
			//cout << "opt bitsize = " << opt_bitsize << endl;
			//cout << "max bitsize = " << max_allowed_bitsize << endl;

			for(ulint p=1;p<30;++p){

				if(assess_bitsize(p,long_codes[p])<=max_allowed_bitsize)
					prefix_length = p;

			}

			//cout << "optimal prefix_length = " << (ulint)prefix_length<<endl;
			//cout << "with the hash table we catch " << code_freq[prefix_length] << "% of the codes!"<<endl;

		}

		//build the code function
		for(ulint i=0;i<codes.size();++i)
			encoding[gaps[i].first] = codes[i];

		ulint H_size = ulint(1)<<prefix_length;

		H_val = packed_view<vector>(log2_max_gap,H_size);
		H_len = packed_view<vector>(intlog2(prefix_length),H_size);

		for(ulint i=0;i<H_size;++i) H_len[i] = 0;

		//build hash

		//store here triples of the form <code,gap value,code length>
		//where code is the left-shifted Huffman code

		for(ulint i=0;i<gaps.size();++i){

			//code length
			auto l = codes[i].size();
			assert(l>0);

			if(l<=prefix_length){

				//the hash is sufficient to decode this code. Compute H entry
				ulint h = 0;

				for(auto b : codes[i])
					h = h*2+b;

				//shift to left so to occupy exactly prefix_length bits
				h = h << (prefix_length-l);

				//fill all combinations of h followed by any bit sequence (in total prefix_length bits)
				for(ulint j=0;j<(ulint(1)<<(prefix_length-l));++j){
					H_val[h+j] = gaps[i].first;
					H_len[h+j] = l;
				}

			}else{

				//pack the code in a memory word
				ulint h = 0;

				for(uint j=0;j<codes[i].size();++j)
					h = h*2 + codes[i][j];

				//left-shift
				h = h << (sizeof(ulint)*8-codes[i].size());

				H_long.push_back(triple(h,gaps[i].first,(uint8_t)codes[i].size()));

			}

		}

		auto comp = [](triple x, triple y){ return std::get<0>(x) < std::get<0>(y); };
		std::sort(H_long.begin(),H_long.end(),comp);

		assert(log2_max_gap>0);

	}